

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void benchmark::RunSpecifiedBenchmarks(BenchmarkReporter *reporter)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  pointer pcVar5;
  pointer ptVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  Instance *benchmark_1;
  ostream *poVar10;
  pointer pIVar11;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  undefined *puVar12;
  char *pcVar13;
  thread *thread_1;
  ulong uVar14;
  pointer iters;
  pointer ptVar15;
  pointer __p;
  thread *thread;
  ulong uVar16;
  Instance *benchmark;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar27;
  undefined1 auVar28 [16];
  vector<std::thread,_std::allocator<std::thread>_> pool;
  string label;
  MutexLock l;
  string spec;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks_1;
  ThreadStats total;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  reports;
  string mem;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  int local_24c;
  BenchmarkReporter *local_248;
  double local_238;
  vector<std::thread,_std::allocator<std::thread>_> local_228;
  thread local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  BenchmarkReporter *local_1f0;
  undefined1 local_1e8 [32];
  string local_1c8 [8];
  undefined8 local_1c0;
  __pthread_internal_list local_1b8;
  long local_1a8;
  double local_1a0;
  double dStack_198;
  ulong local_190;
  Notification *pNStack_188;
  undefined8 local_180;
  string local_178;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  local_158;
  ThreadStats local_138;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_128;
  Instance *local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  double local_e8;
  undefined8 uStack_e0;
  __native_type local_d8;
  condition_variable local_b0 [48];
  undefined1 local_80;
  double local_78;
  double dStack_70;
  ulong local_68;
  ulong uStack_60;
  int local_50;
  double local_48;
  undefined1 local_40;
  ulong local_38;
  
  if (FLAGS_benchmark_list_tests) {
    local_d8.__align = 0;
    local_d8._8_8_ = (undefined8 *)0x0;
    local_d8._16_8_ = 0;
    internal::BenchmarkFamilies::GetInstance();
    local_1e8._16_2_ = 0x2e;
    local_1e8._8_8_ = 1;
    local_1e8._0_8_ = local_1e8 + 0x10;
    bVar8 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,(string *)local_1e8,
                       (vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                        *)&local_d8.__data);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_);
    }
    uVar7 = local_d8._8_8_;
    uVar4 = local_d8.__align;
    if (bVar8) {
      for (; uVar4 != uVar7; uVar4 = (undefined8 *)(uVar4 + 0x50)) {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,*(char **)uVar4,*(undefined8 *)(uVar4 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
               *)&local_d8.__data);
    return;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p,
             FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p +
             FLAGS_benchmark_filter_abi_cxx11_._M_string_length);
  if ((char *)local_178._M_string_length == (char *)0x0) {
    pcVar13 = (char *)0x0;
LAB_00108ca1:
    std::__cxx11::string::_M_replace((ulong)&local_178,0,pcVar13,0x11e8cf);
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)&local_178);
    pcVar13 = (char *)local_178._M_string_length;
    if (iVar9 == 0) goto LAB_00108ca1;
  }
  if (reporter == (BenchmarkReporter *)0x0) {
    iVar9 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
    if (iVar9 == 0) {
      reporter = (BenchmarkReporter *)operator_new(0x10);
      puVar12 = &ConsoleReporter::vtable;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
      if (iVar9 == 0) {
        reporter = (BenchmarkReporter *)operator_new(0x10);
        reporter->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_00129980;
        *(undefined1 *)&reporter[1]._vptr_BenchmarkReporter = 1;
        local_248 = reporter;
        goto LAB_00108d6a;
      }
      iVar9 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
      if (iVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unexpected format: \'",0x14);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             FLAGS_benchmark_format_abi_cxx11_._M_dataplus._M_p,
                             FLAGS_benchmark_format_abi_cxx11_._M_string_length);
        std::operator<<(poVar10,"\'\n");
        exit(1);
      }
      reporter = (BenchmarkReporter *)operator_new(8);
      puVar12 = &CSVReporter::vtable;
    }
    reporter->_vptr_BenchmarkReporter = (_func_int **)(puVar12 + 0x10);
    local_248 = reporter;
  }
  else {
    local_248 = (BenchmarkReporter *)0x0;
  }
LAB_00108d6a:
  internal::GetNullLogInstance();
  if ((char *)local_178._M_string_length != (char *)0x0) {
    local_158.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_start = (Instance *)0x0;
    local_158.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Instance *)0x0;
    local_158.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    internal::BenchmarkFamilies::GetInstance();
    bVar8 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,&local_178,&local_158);
    if (bVar8) {
      if (local_158.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_158.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar16 = 10;
      }
      else {
        pIVar11 = local_158.
                  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = 10;
        do {
          uVar16 = (pIVar11->name)._M_string_length;
          if (uVar16 < uVar14) {
            uVar16 = uVar14;
          }
          pIVar11 = pIVar11 + 1;
          uVar14 = uVar16;
        } while (pIVar11 !=
                 local_158.
                 super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar14 = uVar16 + 7;
      if (FLAGS_benchmark_repetitions < 2) {
        uVar14 = uVar16;
      }
      local_50 = NumCPUs();
      local_48 = CyclesPerSecond();
      local_48 = local_48 / 1000000.0;
      local_40 = CpuScalingEnabled();
      local_38 = uVar14;
      iVar9 = (**reporter->_vptr_BenchmarkReporter)(reporter);
      local_1f0 = reporter;
      if (((char)iVar9 != '\0') &&
         (local_110 = local_158.
                      super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
         local_158.
         super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_158.
         super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        pIVar11 = local_158.
                  super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar11->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&local_228,(long)pIVar11->threads);
          }
          if (0 < FLAGS_benchmark_repetitions) {
            iters = (pointer)0x1;
            local_24c = 0;
            do {
              local_108 = local_f8;
              local_100 = 0;
              local_f8[0] = 0;
              do {
                iVar9 = internal::GetLogLevel();
                if (iVar9 < 2) {
                  poVar10 = internal::GetNullLogInstance();
                }
                else {
                  poVar10 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-- LOG(",7);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Running ",8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(pIVar11->name)._M_dataplus._M_p,
                                     (pIVar11->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," for ",5);
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                __p = (pointer)0x11e60d;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_1e8._0_8_ = GetBenchmarkLock()::lock;
                local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1e8);
                local_1e8[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_.
                _M_string_length = 0;
                *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus.
                 _M_p = '\0';
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1e8);
                local_d8.__data.__list.__next = (__pthread_internal_list *)0x0;
                local_d8._16_8_ = 0;
                local_d8.__data.__list.__prev = (__pthread_internal_list *)0x0;
                local_d8.__align = 0;
                local_d8._8_8_ = 0;
                std::condition_variable::condition_variable(local_b0);
                local_80 = 0;
                this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                        *)operator_new(0xa0);
                iVar9 = pIVar11->threads;
                this[2]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[3]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                (this->_M_t).
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[1]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[4]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                std::condition_variable::condition_variable((condition_variable *)(this + 5));
                *(int *)&this[0xb]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl = iVar9;
                this[0xc]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)&local_d8;
                *(undefined1 *)
                 &this[0xd]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                this[0x10]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x11]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                *(undefined8 *)
                 ((long)&this[0x11]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl + 4) = 0;
                *(undefined8 *)
                 ((long)&this[0x12]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl + 4) = 0;
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset(this,__p);
                ptVar6 = local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                local_138.bytes_processed = 0;
                local_138.items_processed = 0;
                (anonymous_namespace)::running_benchmark = 1;
                if (pIVar11->multithreaded == true) {
                  ptVar15 = local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  if (local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    do {
                      if ((ptVar15->_M_id)._M_thread != 0) {
                        std::thread::join();
                      }
                      ptVar15 = ptVar15 + 1;
                    } while (ptVar15 != ptVar6);
                    if (local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish !=
                        local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                      uVar16 = 0;
                      do {
                        local_210._M_id._M_thread = (id)0;
                        local_1e8._0_8_ = operator_new(0x30);
                        *(undefined ***)local_1e8._0_8_ = &PTR___State_00129898;
                        *(ThreadStats **)(local_1e8._0_8_ + 8) = &local_138;
                        *(ulong *)(local_1e8._0_8_ + 0x10) = uVar16;
                        *(pointer *)(local_1e8._0_8_ + 0x18) = iters;
                        *(pointer *)(local_1e8._0_8_ + 0x20) = pIVar11;
                        *(code **)(local_1e8._0_8_ + 0x28) = anon_unknown_1::RunInThread;
                        __p = (pointer)local_1e8;
                        std::thread::_M_start_thread(&local_210,(pointer)local_1e8,0);
                        if ((long *)local_1e8._0_8_ != (long *)0x0) {
                          (**(code **)(*(long *)local_1e8._0_8_ + 8))();
                        }
                        if (local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar16]._M_id._M_thread != 0) {
                          std::terminate();
                        }
                        local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16]._M_id._M_thread =
                             (native_handle_type)local_210._M_id._M_thread;
                        uVar16 = uVar16 + 1;
                      } while (uVar16 < (ulong)((long)local_228.
                                                                                                            
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_228.
                                                                                                            
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                    }
                  }
                }
                else {
                  __p = iters;
                  anon_unknown_1::RunInThread(pIVar11,(size_t)iters,0,&local_138);
                }
                Notification::WaitForNotification((Notification *)&local_d8.__data);
                pcVar5 = (anonymous_namespace)::timer_manager;
                (anonymous_namespace)::running_benchmark = 0;
                local_1e8._0_8_ = (anonymous_namespace)::timer_manager;
                local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1e8);
                local_1e8[8] = '\x01';
                if (pcVar5[0x68] != '\0') {
                  internal::CheckHandler::CheckHandler
                            ((CheckHandler *)&local_210,"!running_",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                             ,"cpu_time_used",0xc1);
LAB_00109881:
                  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_210);
                }
                internal::GetNullLogInstance();
                dVar18 = *(double *)(pcVar5 + 0x88);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1e8);
                pcVar5 = (anonymous_namespace)::timer_manager;
                local_1e8._0_8_ = (anonymous_namespace)::timer_manager;
                local_1e8[8] = '\0';
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1e8);
                local_1e8[8] = '\x01';
                if (pcVar5[0x68] != '\0') {
                  internal::CheckHandler::CheckHandler
                            ((CheckHandler *)&local_210,"!running_",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                             ,"real_time_used",0xba);
                  goto LAB_00109881;
                }
                internal::GetNullLogInstance();
                dVar23 = *(double *)(pcVar5 + 0x80);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1e8);
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         *)0x0,__p);
                iVar9 = internal::GetLogLevel();
                if (iVar9 < 2) {
                  poVar10 = internal::GetNullLogInstance();
                }
                else {
                  poVar10 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-- LOG(",7);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Ran in ",7);
                poVar10 = std::ostream::_M_insert<double>(dVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"/",1);
                poVar10 = std::ostream::_M_insert<double>(dVar23);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                local_e8 = dVar23;
                if (pIVar11->use_real_time == false) {
                  local_e8 = dVar18;
                }
                uStack_e0 = 0;
                local_210._M_id._M_thread = (id)local_200;
                local_208 = 0;
                local_200[0] = 0;
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_1e8._0_8_ = GetBenchmarkLock()::lock;
                local_1e8[8] = '\0';
                std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1e8);
                local_1e8[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                std::__cxx11::string::_M_assign((string *)&local_210);
                std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1e8);
                uVar16 = -(ulong)(ABS(pIVar11->min_time) < 2.220446049250313e-16);
                dVar27 = (double)(~uVar16 & (ulong)pIVar11->min_time |
                                 (ulong)FLAGS_benchmark_min_time & uVar16);
                bVar17 = iters < (pointer)0x3b9aca00;
                bVar8 = local_e8 < dVar27;
                bVar1 = dVar23 < dVar27 * 5.0;
                if (bVar1 && ((bVar17 && local_24c == 0) && bVar8)) {
                  local_238 = 1e-09;
                  if (1e-09 <= local_e8) {
                    local_238 = local_e8;
                  }
                  local_238 = (dVar27 * 1.4) / local_238;
                  if (local_e8 / dVar27 <= 0.1 && 10.0 <= local_238) {
                    local_238 = 10.0;
                  }
                  iVar9 = internal::GetLogLevel();
                  if (iVar9 < 3) {
                    poVar10 = internal::GetNullLogInstance();
                  }
                  else {
                    poVar10 = internal::GetErrorLogInstance();
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"-- LOG(",7);
                  poVar10 = (ostream *)std::ostream::operator<<(poVar10,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"): ",3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Next iters: ",0xc);
                  dVar27 = (double)(~-(ulong)(1.0 < local_238) & 0x4000000000000000 |
                                   (ulong)local_238 & -(ulong)(1.0 < local_238));
                  dVar23 = dVar27 * (double)(long)iters;
                  dVar18 = (double)(long)iters + 1.0;
                  if (dVar18 <= dVar23) {
                    dVar18 = dVar23;
                  }
                  dVar23 = 1000000000.0;
                  if (dVar18 <= 1000000000.0) {
                    dVar23 = dVar18;
                  }
                  poVar10 = std::ostream::_M_insert<double>(dVar23);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
                  poVar10 = std::ostream::_M_insert<double>(dVar27);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  iters = (pointer)(long)(int)(dVar23 + 0.5);
                }
                else {
                  bVar2 = 0.0 < local_e8;
                  local_68 = local_138.bytes_processed;
                  uStack_60 = local_138.items_processed;
                  local_78 = (double)((ulong)local_138.bytes_processed >> 0x20 | 0x4530000000000000)
                             - 1.9342813118337666e+25;
                  dStack_70 = (double)((ulong)local_138.items_processed >> 0x20 | 0x4530000000000000
                                      ) - 1.9342813118337666e+25;
                  local_1e8._0_8_ = local_1e8 + 0x10;
                  local_1e8._8_8_ = 0;
                  local_1e8._16_2_ = local_1e8._16_2_ & 0xff00;
                  local_1c8 = (string  [8])&local_1b8;
                  local_1c0._0_1_ = (Condition)0x0;
                  local_1c0._1_7_ = 0;
                  local_1b8.__prev._0_1_ = 0;
                  local_1a8 = 1;
                  local_180._0_1_ = false;
                  local_180._1_7_ = 0;
                  local_190 = 0;
                  pNStack_188 = (Notification *)0x0;
                  local_1a0 = 0.0;
                  dStack_198 = 0.0;
                  std::__cxx11::string::_M_assign((string *)local_1e8);
                  std::__cxx11::string::_M_assign(local_1c8);
                  auVar3._8_8_ = uStack_60;
                  auVar3._0_8_ = local_68;
                  auVar19 = auVar3 ^ _DAT_0011d320;
                  auVar24._0_4_ = -(uint)((int)DAT_0011d320 < auVar19._0_4_);
                  iVar9 = -(uint)(DAT_0011d320._4_4_ < auVar19._4_4_);
                  auVar24._8_4_ = -(uint)(DAT_0011d320._8_4_ < auVar19._8_4_);
                  iVar26 = -(uint)(DAT_0011d320._12_4_ < auVar19._12_4_);
                  auVar20._4_4_ = -(uint)(auVar19._4_4_ == DAT_0011d320._4_4_);
                  auVar20._12_4_ = -(uint)(auVar19._12_4_ == DAT_0011d320._12_4_);
                  auVar20._0_4_ = auVar20._4_4_;
                  auVar20._8_4_ = auVar20._12_4_;
                  auVar21._1_3_ = 0;
                  auVar21[0] = bVar2;
                  auVar24._4_4_ = auVar24._0_4_;
                  auVar24._12_4_ = auVar24._8_4_;
                  auVar19._4_4_ = iVar9;
                  auVar19._0_4_ = iVar9;
                  auVar19._8_4_ = iVar26;
                  auVar19._12_4_ = iVar26;
                  auVar21[4] = bVar2;
                  auVar21._5_3_ = 0;
                  auVar21[8] = bVar2;
                  auVar21._9_3_ = 0;
                  auVar21[0xc] = bVar2;
                  auVar21._13_3_ = 0;
                  auVar21 = auVar21 & (auVar24 & auVar20 | auVar19);
                  auVar22._0_8_ =
                       CONCAT44((auVar21._4_4_ << 0x1f) >> 0x1f,(auVar21._0_4_ << 0x1f) >> 0x1f);
                  auVar22._8_4_ = (auVar21._8_4_ << 0x1f) >> 0x1f;
                  auVar22._12_4_ = (auVar21._12_4_ << 0x1f) >> 0x1f;
                  auVar19 = auVar3 & _DAT_0011d330 | _DAT_0011d340;
                  auVar28._0_8_ = auVar19._0_8_ + local_78;
                  auVar28._8_8_ = auVar19._8_8_ + dStack_70;
                  auVar25._8_8_ = local_e8;
                  auVar25._0_8_ = local_e8;
                  auVar19 = divpd(auVar28,auVar25);
                  local_190 = auVar19._0_8_ & auVar22._0_8_;
                  pNStack_188 = (Notification *)(auVar19._8_8_ & auVar22._8_8_);
                  local_1a8 = (long)pIVar11->threads * (long)iters;
                  local_1a0 = dVar23;
                  dStack_198 = dVar18;
                  std::
                  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ::push_back(&local_128,(value_type *)local_1e8);
                  if (local_1c8 != (string  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                    operator_delete((void *)local_1e8._0_8_);
                  }
                }
                if (local_210._M_id._M_thread != (id)local_200) {
                  operator_delete((void *)local_210._M_id._M_thread);
                }
                std::condition_variable::~condition_variable(local_b0);
              } while (bVar1 && ((bVar17 && local_24c == 0) && bVar8));
              if (local_108 != local_f8) {
                operator_delete(local_108);
              }
              local_24c = local_24c + 1;
            } while (local_24c < FLAGS_benchmark_repetitions);
          }
          (*local_1f0->_vptr_BenchmarkReporter[1])(local_1f0,&local_128);
          ptVar6 = local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar15 = local_228.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar11->multithreaded == true) {
            for (; ptVar15 != ptVar6; ptVar15 = ptVar15 + 1) {
              std::thread::join();
            }
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_228);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&local_128);
          pIVar11 = pIVar11 + 1;
          reporter = local_1f0;
        } while (pIVar11 != local_110);
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector(&local_158);
  }
  (*reporter->_vptr_BenchmarkReporter[2])(reporter);
  if (local_248 != (BenchmarkReporter *)0x0) {
    (*local_248->_vptr_BenchmarkReporter[4])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunSpecifiedBenchmarks(BenchmarkReporter* reporter) {
  if (FLAGS_benchmark_list_tests) {
    internal::PrintBenchmarkList();
    return;
  }
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::unique_ptr<BenchmarkReporter> default_reporter;
  if (!reporter) {
    default_reporter = internal::GetDefaultReporter();
    reporter = default_reporter.get();
  }
  internal::RunMatchingBenchmarks(spec, reporter);
  reporter->Finalize();
}